

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  ImGuiItemStatusFlags *pIVar1;
  int *piVar2;
  short *psVar3;
  ImRect *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImGuiNavLayer IVar10;
  uint uVar11;
  int iVar12;
  ImGuiWindow *pIVar13;
  ImGuiWindow *pIVar14;
  float fVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  bool bVar18;
  uint uVar19;
  ImGuiID id_1;
  ImGuiNavItemData *pIVar20;
  ImGuiWindow *window;
  ImGuiContext *g;
  float fVar21;
  ImVec2 IVar22;
  ImVec2 IVar23;
  
  pIVar16 = GImGui;
  pIVar13 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar22 = bb->Max;
  (pIVar16->LastItemData).Rect.Min = bb->Min;
  (pIVar16->LastItemData).Rect.Max = IVar22;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  IVar22 = nav_bb_arg->Max;
  (pIVar16->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar16->LastItemData).NavRect.Max = IVar22;
  uVar19 = extra_flags | pIVar16->CurrentItemFlags;
  (pIVar16->LastItemData).InFlags = uVar19;
  (pIVar16->LastItemData).StatusFlags = 0;
  if (id == 0) goto LAB_00160b9e;
  IVar10 = (pIVar13->DC).NavLayerCurrent;
  psVar3 = &(pIVar13->DC).NavLayersActiveMaskNext;
  *psVar3 = *psVar3 | (ushort)(1 << ((byte)IVar10 & 0x1f));
  if ((((pIVar16->NavId == id) || (pIVar16->NavAnyRequest == true)) &&
      (pIVar14 = pIVar16->NavWindow, pIVar14->RootWindowForNav == pIVar13->RootWindowForNav)) &&
     ((pIVar13 == pIVar14 || (((uint)(pIVar14->Flags | pIVar13->Flags) >> 0x17 & 1) != 0)))) {
    fVar5 = (pIVar16->LastItemData).NavRect.Min.x;
    fVar6 = (pIVar16->LastItemData).NavRect.Min.y;
    fVar7 = (pIVar16->LastItemData).NavRect.Max.x;
    fVar8 = (pIVar16->LastItemData).NavRect.Max.y;
    if ((pIVar16->NavInitRequest == true) && (pIVar16->NavLayer == IVar10)) {
      if (((uVar19 & 0x14) == 0) || (pIVar16->NavInitResultId == 0)) {
        pIVar16->NavInitResultId = id;
        fVar21 = (pIVar13->DC).CursorStartPos.x;
        fVar9 = (pIVar13->DC).CursorStartPos.y;
        IVar22.x = fVar5 - fVar21;
        IVar22.y = fVar6 - fVar9;
        IVar23.x = fVar7 - fVar21;
        IVar23.y = fVar8 - fVar9;
        (pIVar16->NavInitResultRectRel).Min = IVar22;
        (pIVar16->NavInitResultRectRel).Max = IVar23;
      }
      if ((uVar19 & 0x14) == 0) {
        pIVar16->NavInitRequest = false;
        if (pIVar16->NavMoveScoringItems == false) {
          pIVar16->NavAnyRequest = false;
        }
        else {
          pIVar16->NavAnyRequest = true;
          if (pIVar16->NavWindow == (ImGuiWindow *)0x0) goto LAB_00160cba;
        }
      }
    }
    if (pIVar16->NavMoveScoringItems == true) {
      uVar11 = pIVar16->NavMoveFlags;
      if ((uVar11 >> 10 & 1) == 0) {
        if ((uVar19 & 0xc) == 0 && ((uVar11 & 0x10) != 0 || pIVar16->NavId != id)) {
          pIVar20 = &pIVar16->NavMoveResultOther;
          if (pIVar13 == pIVar16->NavWindow) {
            pIVar20 = &pIVar16->NavMoveResultLocal;
          }
          bVar17 = NavScoreItem(pIVar20);
          if (bVar17) {
            NavApplyItemToResult(pIVar20);
          }
          if (((((pIVar16->NavMoveFlags & 0x20) != 0) &&
               (fVar21 = (pIVar13->ClipRect).Max.y, fVar6 < fVar21)) &&
              (fVar9 = (pIVar13->ClipRect).Min.y, fVar9 < fVar8)) &&
             ((fVar5 < (pIVar13->ClipRect).Max.x &&
              ((pIVar13->ClipRect).Min.x <= fVar7 && fVar7 != (pIVar13->ClipRect).Min.x)))) {
            fVar15 = fVar21;
            if (fVar8 <= fVar21) {
              fVar15 = fVar8;
            }
            if (fVar6 <= fVar21) {
              fVar21 = fVar6;
            }
            if ((fVar8 - fVar6) * 0.7 <=
                (float)(-(uint)(fVar8 < fVar9) & (uint)fVar9 |
                       ~-(uint)(fVar8 < fVar9) & (uint)fVar15) -
                (float)(-(uint)(fVar6 < fVar9) & (uint)fVar9 |
                       ~-(uint)(fVar6 < fVar9) & (uint)fVar21)) {
              pIVar20 = &pIVar16->NavMoveResultLocalVisible;
              bVar17 = NavScoreItem(pIVar20);
              if (bVar17) goto LAB_00160f63;
            }
          }
        }
      }
      else if ((uVar19 & 0x105) == 0x100 || (uVar11 >> 9 & 1) != 0) {
        pIVar20 = &pIVar16->NavMoveResultLocal;
        iVar12 = pIVar16->NavTabbingDir;
        if (iVar12 == -1) {
          if (pIVar16->NavId == id) {
            if ((pIVar16->NavMoveResultLocal).ID != 0) {
              pIVar16->NavMoveScoringItems = false;
              pIVar16->NavAnyRequest = pIVar16->NavInitRequest;
              if ((pIVar16->NavInitRequest == true) && (pIVar16->NavWindow == (ImGuiWindow *)0x0)) {
LAB_00160cba:
                __assert_fail("g.NavWindow != __null",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                              ,0x2986,"void ImGui::NavUpdateAnyRequestFlag()");
              }
            }
          }
          else {
LAB_00160f63:
            NavApplyItemToResult(pIVar20);
          }
        }
        else if (iVar12 == 0) {
          if ((pIVar16->NavTabbingResultFirst).ID == 0) {
            pIVar20 = &pIVar16->NavTabbingResultFirst;
LAB_00160f6d:
            NavMoveRequestResolveWithLastItem(pIVar20);
          }
        }
        else if (iVar12 == 1) {
          if ((pIVar16->NavTabbingResultFirst).ID == 0) {
            NavApplyItemToResult(&pIVar16->NavTabbingResultFirst);
          }
          piVar2 = &pIVar16->NavTabbingCounter;
          *piVar2 = *piVar2 + -1;
          if (*piVar2 == 0) goto LAB_00160f6d;
          if (pIVar16->NavId == id) {
            pIVar16->NavTabbingCounter = 1;
          }
        }
      }
    }
    if (pIVar16->NavId == id) {
      pIVar16->NavWindow = pIVar13;
      IVar10 = (pIVar13->DC).NavLayerCurrent;
      pIVar16->NavLayer = IVar10;
      pIVar16->NavFocusScopeId = (pIVar13->DC).NavFocusScopeIdCurrent;
      pIVar16->NavIdIsAlive = true;
      fVar21 = (pIVar13->DC).CursorStartPos.x;
      fVar9 = (pIVar13->DC).CursorStartPos.y;
      pIVar4 = pIVar13->NavRectRel + IVar10;
      (pIVar4->Min).x = fVar5 - fVar21;
      (pIVar4->Min).y = fVar6 - fVar9;
      (pIVar4->Max).x = fVar7 - fVar21;
      (pIVar4->Max).y = fVar8 - fVar9;
    }
  }
  if (pIVar13->ID == id) {
    __assert_fail("id != window->ID && \"Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x22ec,
                  "bool ImGui::ItemAdd(const ImRect &, ImGuiID, const ImRect *, ImGuiItemFlags)");
  }
LAB_00160b9e:
  (pIVar16->NextItemData).Flags = 0;
  bVar17 = IsClippedEx(bb,id);
  if ((!bVar17) && (bVar18 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar18)) {
    pIVar1 = &(pIVar16->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 1;
  }
  return !bVar17;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}